

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CsvHelper.cpp
# Opt level: O0

int CsvHelper::read_number(int *number,size_t start,char *buffer,size_t buffer_max)

{
  char *pcVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int local_84;
  int last_comma_index;
  int has_comma;
  int text_max;
  char text [64];
  int local_2c;
  int x;
  size_t buffer_max_local;
  char *buffer_local;
  size_t start_local;
  int *number_local;
  
  local_2c = 0;
  bVar4 = false;
  local_84 = -1;
  buffer_local = (char *)start;
  while( true ) {
    bVar3 = false;
    if ((buffer_local < buffer_max) && (bVar3 = true, buffer[(long)buffer_local] != ' ')) {
      bVar3 = buffer[(long)buffer_local] == '\t';
    }
    if (!bVar3) break;
    buffer_local = buffer_local + 1;
  }
  if ((buffer_local < buffer_max) && (pcVar1 = buffer_local, buffer[(long)buffer_local] == '\"')) {
    while( true ) {
      while( true ) {
        buffer_local = pcVar1 + 1;
        bVar3 = false;
        if (buffer_local < buffer_max) {
          bVar3 = buffer[(long)buffer_local] != '\0';
        }
        if (!bVar3) goto LAB_001a59fe;
        if (buffer[(long)buffer_local] == '\"') {
          buffer_local = pcVar1 + 2;
          goto LAB_001a59fe;
        }
        pcVar1 = buffer_local;
        if (buffer[(long)buffer_local] == ',') break;
        if (local_2c < 0x3f) {
          *(char *)((long)&has_comma + (long)local_2c) = buffer[(long)buffer_local];
          local_2c = local_2c + 1;
        }
      }
      if ((bVar4) && (local_2c - local_84 != 3)) break;
      bVar4 = true;
      local_84 = local_2c;
    }
    *(undefined1 *)((long)&has_comma + (long)local_2c) = 0x2c;
    local_2c = local_2c + 1;
  }
  else {
    while( true ) {
      bVar4 = false;
      if ((buffer_local < buffer_max) && (bVar4 = false, buffer[(long)buffer_local] != '\0')) {
        bVar4 = buffer[(long)buffer_local] != ',';
      }
      if (!bVar4) break;
      if (local_2c < 0x3f) {
        *(char *)((long)&has_comma + (long)local_2c) = buffer[(long)buffer_local];
        local_2c = local_2c + 1;
      }
      buffer_local = buffer_local + 1;
    }
  }
LAB_001a59fe:
  *(undefined1 *)((long)&has_comma + (long)local_2c) = 0;
  iVar2 = atoi((char *)&has_comma);
  *number = iVar2;
  do {
    if (buffer_max <= buffer_local) {
LAB_001a5a77:
      return (int)buffer_local;
    }
    if (buffer[(long)buffer_local] == ',') {
      buffer_local = buffer_local + 1;
      goto LAB_001a5a77;
    }
    if ((buffer[(long)buffer_local] != ' ') && (buffer[(long)buffer_local] != '\t'))
    goto LAB_001a5a77;
    buffer_local = buffer_local + 1;
  } while( true );
}

Assistant:

int CsvHelper::read_number(int * number, size_t start, char const * buffer, size_t buffer_max)
{
    int x = 0;
    char text[64];
    int text_max = sizeof(text);
    int has_comma = 0;
    int last_comma_index = -1;


    /* Skip blanks */
    while (start < buffer_max && (buffer[start] == ' ' || buffer[start] == '\t'))
    {
        start++;
    }

    /* If quoted, remove the quotes */
    if (start < buffer_max && buffer[start] == '"')
    {
        start++;
        while (start < buffer_max && buffer[start] != 0)
        {
            if (buffer[start] == '"')
            {
                /* Skip the quote and break. */
                start++;
                break;
            }
            else if (buffer[start] == ',')
            {
                /* Skip the comma unless there is a syntax error. */
                if (has_comma != 0)
                {
                    if ((x - last_comma_index) != 3)
                    {
                        text[x++] = ',';
                        break;
                    }
                }

                has_comma = 1;
                last_comma_index = x;
                start++;
            }
            else
            {
                if (x < (text_max - 1))
                {
                    text[x] = buffer[start];
                    x++;
                }
                start++;
            }
        }
    }
    else
    {
        while (start < buffer_max && buffer[start] != 0 && buffer[start] != ',')
        {
            if (x < (text_max - 1))
            {
                text[x] = buffer[start];
                x++;
            }
            start++;
        }
    }
    text[x] = 0;

    *number = atoi(text);

    /* Skip comma */
    while (start < buffer_max)
    {
        if (buffer[start] == ',')
        {
            start++;
            break;
        }
        else if (buffer[start] == ' ' || buffer[start] == '\t')
        {
            start++;
        }
        else
        {
            break;
        }
    }

    return (int)start;
}